

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32_c_api_tests.c
# Opt level: O3

void create_encoded_string_storage_from_DecodedResult_smallExample_isSuccessful(void)

{
  bech32_DecodedResult *decodedResult;
  bech32_bstring *bstring;
  char bstr [14];
  char local_20 [16];
  
  builtin_strncpy(local_20 + 8,"dvupm",6);
  builtin_strncpy(local_20,"xyz1pzr9",8);
  decodedResult = bech32_create_DecodedResult(local_20);
  if (decodedResult == (bech32_DecodedResult *)0x0) {
    __assert_fail("decodedResult != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_c_api_tests.c"
                  ,0x24b,
                  "void create_encoded_string_storage_from_DecodedResult_smallExample_isSuccessful(void)"
                 );
  }
  bstring = bech32_create_bstring_from_DecodedResult(decodedResult);
  if (bstring != (bech32_bstring *)0x0) {
    bech32_free_DecodedResult(decodedResult);
    bech32_free_bstring(bstring);
    return;
  }
  __assert_fail("bstring != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_c_api_tests.c"
                ,0x24e,
                "void create_encoded_string_storage_from_DecodedResult_smallExample_isSuccessful(void)"
               );
}

Assistant:

void create_encoded_string_storage_from_DecodedResult_smallExample_isSuccessful(void) {
    char bstr[] = "xyz1pzr9dvupm";
    bech32_DecodedResult *decodedResult = bech32_create_DecodedResult(bstr);
    assert(decodedResult != NULL);

    bech32_bstring *bstring = bech32_create_bstring_from_DecodedResult(decodedResult);
    assert(bstring != NULL);

    bech32_free_DecodedResult(decodedResult);
    bech32_free_bstring(bstring);
}